

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_handle.cpp
# Opt level: O1

shared_ptr<const_libtorrent::torrent_info> __thiscall
libtorrent::torrent_handle::
sync_call_ret<std::shared_ptr<libtorrent::torrent_info_const>,std::shared_ptr<libtorrent::torrent_info_const>(libtorrent::aux::torrent::*)()const>
          (torrent_handle *this,shared_ptr<const_libtorrent::torrent_info> *def,
          offset_in_torrent_to_subr f)

{
  int iVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  session_impl *ses;
  int iVar3;
  undefined8 uVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar6;
  shared_ptr<const_libtorrent::torrent_info> sVar7;
  bool done;
  exception_ptr ex;
  bool local_79;
  exception_ptr local_78;
  void *local_70;
  type_conflict8 local_68;
  io_context *local_28;
  undefined4 local_1c;
  
  this_00 = (def->super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>).
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    iVar3 = this_00->_M_use_count;
    do {
      if (iVar3 == 0) {
        this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        break;
      }
      LOCK();
      iVar1 = this_00->_M_use_count;
      bVar6 = iVar3 == iVar1;
      if (bVar6) {
        this_00->_M_use_count = iVar3 + 1;
        iVar1 = iVar3;
      }
      iVar3 = iVar1;
      UNLOCK();
    } while (!bVar6);
  }
  if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    bVar6 = true;
  }
  else {
    bVar6 = this_00->_M_use_count == 0;
  }
  if (bVar6) {
    local_68.t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
  }
  else {
    local_68.t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         (def->super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>).
         _M_ptr;
  }
  (this->m_torrent).super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       *(element_type **)f;
  p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(f + 8);
  (this->m_torrent).super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var2;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  if (local_68.t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    throw_invalid_handle();
  }
  ses = (session_impl *)
        ((local_68.t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         )->super_torrent_hot_members).m_ses;
  local_68.done = &local_79;
  local_79 = false;
  local_68.ex = &local_78;
  local_78._M_exception_object = (void *)0x0;
  local_28 = ses->m_io_context;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  local_1c = 0;
  local_68.r = (shared_ptr<const_libtorrent::torrent_info> *)this;
  local_68.ses = ses;
  local_68.t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = this_00;
  boost::asio::io_context::basic_executor_type<std::allocator<void>,0u>::
  execute<libtorrent::torrent_handle::sync_call_ret<std::shared_ptr<libtorrent::torrent_info_const>,std::shared_ptr<libtorrent::torrent_info_const>(libtorrent::aux::torrent::*)()const>(std::shared_ptr<libtorrent::torrent_info_const>,std::shared_ptr<libtorrent::torrent_info_const>(libtorrent::aux::torrent::*)()const)const::_lambda()_1_>
            ((basic_executor_type<std::allocator<void>,0u> *)&local_28,&local_68);
  if (local_68.t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68.t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  aux::torrent_wait(&local_79,ses);
  if (local_78._M_exception_object != (void *)0x0) {
    local_70 = local_78._M_exception_object;
    ::std::__exception_ptr::exception_ptr::_M_addref();
    uVar4 = ::std::rethrow_exception((exception_ptr)&local_70);
    if (local_70 != (void *)0x0) {
      ::std::__exception_ptr::exception_ptr::_M_release();
    }
    if (local_78._M_exception_object != (void *)0x0) {
      ::std::__exception_ptr::exception_ptr::_M_release();
    }
    p_Var2 = (this->m_torrent).
             super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    }
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    _Unwind_Resume(uVar4);
  }
  _Var5._M_pi = extraout_RDX;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    _Var5._M_pi = extraout_RDX_00;
  }
  sVar7.super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var5._M_pi;
  sVar7.super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<const_libtorrent::torrent_info>)
         sVar7.super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Ret torrent_handle::sync_call_ret(Ret def, Fun f, Args&&... a) const
	{
		auto t = m_torrent.lock();
		Ret r = def;
#ifndef BOOST_NO_EXCEPTIONS
		if (!t) throw_invalid_handle();
#else
		if (!t) return r;
#endif
		auto& ses = static_cast<session_impl&>(t->session());

		// this is the flag to indicate the call has completed
		bool done = false;

		std::exception_ptr ex;
		dispatch(ses.get_context(), [=,&r,&done,&ses,&ex] ()
		{
#ifndef BOOST_NO_EXCEPTIONS
			try {
#endif
				r = (t.get()->*f)(std::move(a)...);
#ifndef BOOST_NO_EXCEPTIONS
			} catch (...) {
				ex = std::current_exception();
			}
#endif
			std::unique_lock<std::mutex> l(ses.mut);
			done = true;
			ses.cond.notify_all();
		} );

		aux::torrent_wait(done, ses);

		if (ex) std::rethrow_exception(ex);
		return r;
	}